

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

int execmd_recurs(voccxdef *ctx,objnum actor,objnum verb,objnum dobj,objnum prep,objnum iobj,
                 int validate_dobj,int validate_iobj)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  short in_CX;
  void *in_RDI;
  short in_R9W;
  uint tplofs;
  uint actofs;
  runsdef *orig_bp;
  runsdef *orig_sp;
  voccxdef ctx_copy;
  vocoldef iobjv;
  vocoldef dobjv;
  uchar tpl [16];
  int newstyle;
  int err;
  undefined4 in_stack_ffffffffffffed28;
  undefined4 in_stack_ffffffffffffed2c;
  uint *in_stack_ffffffffffffed30;
  objnum in_stack_ffffffffffffed3e;
  undefined4 in_stack_ffffffffffffed40;
  undefined4 in_stack_ffffffffffffed44;
  undefined4 in_stack_ffffffffffffed50;
  undefined4 in_stack_ffffffffffffed54;
  uchar *in_stack_ffffffffffffed58;
  objnum in_stack_ffffffffffffed64;
  objnum in_stack_ffffffffffffed66;
  undefined4 in_stack_ffffffffffffed68;
  undefined4 in_stack_ffffffffffffed6c;
  int local_126c;
  undefined1 local_1258 [16];
  long local_1248;
  vocoldef *in_stack_fffffffffffff3d8;
  objnum *in_stack_fffffffffffff3e0;
  vocoldef *in_stack_fffffffffffff3e8;
  objnum in_stack_fffffffffffff3f4;
  objnum in_stack_fffffffffffff3f6;
  voccxdef *in_stack_fffffffffffff3f8;
  int in_stack_fffffffffffff410;
  uchar *in_stack_fffffffffffff418;
  int in_stack_fffffffffffff420;
  int in_stack_fffffffffffff428;
  int in_stack_fffffffffffff430;
  int in_stack_fffffffffffff438;
  vocoldef *in_stack_fffffffffffff440;
  int in_stack_fffffffffffff448;
  int in_stack_fffffffffffff450;
  int in_stack_fffffffffffff458;
  int in_stack_fffffffffffff460;
  int local_28;
  
  uVar1 = *(undefined8 *)(*(long *)((long)in_RDI + 0x10) + 0x20);
  uVar2 = *(undefined8 *)(*(long *)((long)in_RDI + 0x10) + 0x28);
  memcpy(local_1258,in_RDI,0x11c0);
  if (in_CX == -1) {
    exe_get_tpl((voccxdef *)CONCAT44(in_stack_ffffffffffffed44,in_stack_ffffffffffffed40),
                in_stack_ffffffffffffed3e,in_stack_ffffffffffffed30,
                (uint *)CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28));
    if (local_126c == 0) {
      local_28 = 0x4b0;
    }
    else {
      local_28 = exe1cmd(in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f6,
                         in_stack_fffffffffffff3f4,in_stack_fffffffffffff3e8,
                         in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                         in_stack_fffffffffffff410,in_stack_fffffffffffff418,
                         in_stack_fffffffffffff420,in_stack_fffffffffffff428,
                         in_stack_fffffffffffff430,in_stack_fffffffffffff438,
                         in_stack_fffffffffffff440,in_stack_fffffffffffff448,
                         in_stack_fffffffffffff450,in_stack_fffffffffffff458,
                         in_stack_fffffffffffff460);
    }
  }
  else if (in_R9W == -1) {
    iVar3 = voctplfnd((voccxdef *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68),
                      in_stack_ffffffffffffed66,in_stack_ffffffffffffed64,in_stack_ffffffffffffed58,
                      (int *)CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50));
    if (iVar3 == 0) {
      local_28 = 0x4b0;
    }
    else {
      local_28 = exe1cmd(in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f6,
                         in_stack_fffffffffffff3f4,in_stack_fffffffffffff3e8,
                         in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                         in_stack_fffffffffffff410,in_stack_fffffffffffff418,
                         in_stack_fffffffffffff420,in_stack_fffffffffffff428,
                         in_stack_fffffffffffff430,in_stack_fffffffffffff438,
                         in_stack_fffffffffffff440,in_stack_fffffffffffff448,
                         in_stack_fffffffffffff450,in_stack_fffffffffffff458,
                         in_stack_fffffffffffff460);
    }
  }
  else {
    iVar3 = voctplfnd((voccxdef *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68),
                      in_stack_ffffffffffffed66,in_stack_ffffffffffffed64,in_stack_ffffffffffffed58,
                      (int *)CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50));
    if (iVar3 == 0) {
      local_28 = 0x4b0;
    }
    else {
      local_28 = exe1cmd(in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f6,
                         in_stack_fffffffffffff3f4,in_stack_fffffffffffff3e8,
                         in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8,
                         in_stack_fffffffffffff410,in_stack_fffffffffffff418,
                         in_stack_fffffffffffff420,in_stack_fffffffffffff428,
                         in_stack_fffffffffffff430,in_stack_fffffffffffff438,
                         in_stack_fffffffffffff440,in_stack_fffffffffffff448,
                         in_stack_fffffffffffff450,in_stack_fffffffffffff458,
                         in_stack_fffffffffffff460);
    }
  }
  if (local_28 == 0x419) {
    local_28 = 0x3f5;
  }
  *(undefined8 *)(local_1248 + 0x20) = uVar1;
  *(undefined8 *)(local_1248 + 0x28) = uVar2;
  return local_28;
}

Assistant:

int execmd_recurs(voccxdef *ctx, objnum actor, objnum verb,
                  objnum dobj, objnum prep, objnum iobj,
                  int validate_dobj, int validate_iobj)
{
    int       err;
    int       newstyle;
    uchar     tpl[VOCTPL2SIZ];
    vocoldef  dobjv;
    vocoldef  iobjv;
    voccxdef  ctx_copy;
    runsdef *orig_sp;
    runsdef *orig_bp;

    /*
     *   Save the stack and base pointers as they are on entry.  Since
     *   exe1cmd() is being called recursively, it won't automatically clear
     *   the stack after it's done as it would at the top level; this means
     *   that an aborted frame can be left on the stack if we throw an
     *   'exit' or 'abort' in the course of executing the command.  To make
     *   sure we don't leave any aborted frames on the stack before
     *   returning to our caller, we simply need to restore the stack and
     *   frame pointers on the way out as they were on the way in.  
     */
    orig_sp = ctx->voccxrun->runcxsp;
    orig_bp = ctx->voccxrun->runcxbp;

    /* make a copy of the voc context, so that changes aren't permanent */
    ctx_copy = *ctx;
    ctx = &ctx_copy;

    /* 
     *   there are no unknown words in the recursive command, since the
     *   command was prepared directly from resolved objects 
     */
    ctx->voccxunknown = 0;

    /* set up the vocoldef structure for the direct object, if present */
    if (dobj != MCMONINV)
    {
        dobjv.vocolobj = dobj;
        dobjv.vocolfst = dobjv.vocollst = "";
        dobjv.vocolflg = 0;
    }

    /* set up the vocoldef structure for the indirect object, if present */
    if (iobj != MCMONINV)
    {
        iobjv.vocolobj = iobj;
        iobjv.vocolfst = iobjv.vocollst = "";
        iobjv.vocolflg = 0;
    }
    
    /* figure out which template we need, based on the objects provided */
    if (dobj == MCMONINV)
    {
        uint actofs;
        uint tplofs;
        
        /* 
         *   No objects were provided - use the verb's "action" method.
         *   Make sure that there is in fact an "action" method. 
         */
        exe_get_tpl(ctx, verb, &tplofs, &actofs);
        if (actofs != 0)
        {
            /* execute the "action" method */
            err = exe1cmd(ctx, actor, verb, 0, &prep, 0, FALSE,
                          0, FALSE, TRUE, validate_dobj, validate_iobj,
                          0, 0, 0, FALSE, 0);
        }
        else
        {
            /* indicate that the sentence structure wasn't understood */
            err = ERR_PRS_SENT_UNK;
        }
    }
    else if (iobj == MCMONINV)
    {
        /* 
         *   No indirect object was provided, but a direct object is
         *   present - use the one-object template.  First, look up the
         *   template.  
         */
        if (voctplfnd(ctx, verb, MCMONINV, tpl, &newstyle))
        {
            /* execute the command */
            err = exe1cmd(ctx, actor, verb, &dobjv, &prep, 0, FALSE,
                          tpl, newstyle, TRUE, validate_dobj, validate_iobj,
                          &dobjv, 0, 1, FALSE, 0);
        }
        else
        {
            /* indicate that the sentence structure wasn't understood */
            err = ERR_PRS_SENT_UNK;
        }
    }
    else
    {
        /* 
         *   Both a direct and indirect object were provided - find the
         *   two-object template for the given preposition.
         */
        if (voctplfnd(ctx, verb, prep, tpl, &newstyle))
        {
            /* execute the command */
            err = exe1cmd(ctx, actor, verb, &dobjv, &prep, &iobjv, FALSE,
                          tpl, newstyle, TRUE, validate_dobj, validate_iobj,
                          &dobjv, 0, 1, FALSE, 0);
        }
        else
        {
            /* indicate that the sentence structure wasn't understood */
            err = ERR_PRS_SENT_UNK;
        }
    }

    /* 
     *   if the error was EXITPRECMD, change it to EXIT - EXITPRECMD is a
     *   special flag indicating that we exited from a preCommand
     *   function, which is different than normal exiting internally but
     *   not to the game 
     */
    if (err == ERR_RUNEXITPRECMD)
        err = ERR_RUNEXIT;

    /*
     *   restore the original stack and base pointers, to ensure that we
     *   don't leave any aborted frames on the stack 
     */
    ctx->voccxrun->runcxsp = orig_sp;
    ctx->voccxrun->runcxbp = orig_bp;

    /* return the result code */
    return err;
}